

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O3

int __thiscall llvm::sys::unicode::columnWidthUTF8(unicode *this,StringRef Text)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  ConversionResult CVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  UTF32 buf [1];
  UTF32 *Target;
  UTF8 *Start;
  uint local_48;
  uint local_44;
  UTF32 *local_40;
  unicode *local_38;
  
  pcVar7 = Text.Data;
  if (pcVar7 == (char *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    pcVar8 = (char *)0x0;
    do {
      uVar3 = getNumBytesForUTF8((UTF8)this[(long)pcVar8]);
      if (uVar3 == 0) {
        return -2;
      }
      pcVar1 = pcVar8 + uVar3;
      if (pcVar7 < pcVar1) {
        return -2;
      }
      local_38 = (unicode *)(pcVar8 + (long)this);
      local_40 = &local_48;
      CVar4 = ConvertUTF8toUTF32((UTF8 **)&local_38,(UTF8 *)(local_38 + uVar3),&local_40,&local_44,
                                 strictConversion);
      uVar3 = local_48;
      if (CVar4 != conversionOK) {
        return -2;
      }
      bVar2 = isPrintable(local_48);
      if (!bVar2) {
        return -1;
      }
      if (charWidth(int)::CombiningCharacters == '\0') {
        columnWidthUTF8();
      }
      local_44 = uVar3;
      bVar2 = std::binary_search<llvm::sys::UnicodeCharRange_const*,unsigned_int>
                        (charWidth(int)::CombiningCharacters,
                         charWidth(int)::CombiningCharacters + DAT_00258bd8,&local_44);
      iVar5 = 0;
      if (!bVar2) {
        if (charWidth(int)::DoubleWidthCharacters == '\0') {
          columnWidthUTF8();
        }
        local_44 = uVar3;
        bVar2 = std::binary_search<llvm::sys::UnicodeCharRange_const*,unsigned_int>
                          (charWidth(int)::DoubleWidthCharacters,
                           charWidth(int)::DoubleWidthCharacters + DAT_00258bf0,&local_44);
        iVar5 = bVar2 + 1;
      }
      iVar6 = iVar6 + iVar5;
      pcVar8 = pcVar1;
    } while (pcVar1 < pcVar7);
  }
  return iVar6;
}

Assistant:

int columnWidthUTF8(StringRef Text) {
  unsigned ColumnWidth = 0;
  unsigned Length;
  for (size_t i = 0, e = Text.size(); i < e; i += Length) {
    Length = getNumBytesForUTF8(Text[i]);
    if (Length <= 0 || i + Length > Text.size())
      return ErrorInvalidUTF8;
    UTF32 buf[1];
    const UTF8 *Start = reinterpret_cast<const UTF8 *>(Text.data() + i);
    UTF32 *Target = &buf[0];
    if (conversionOK != ConvertUTF8toUTF32(&Start, Start + Length, &Target,
                                           Target + 1, strictConversion))
      return ErrorInvalidUTF8;
    int Width = charWidth(buf[0]);
    if (Width < 0)
      return ErrorNonPrintableCharacter;
    ColumnWidth += Width;
  }
  return ColumnWidth;
}